

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::ComputeObjectMaxPath(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *psVar5;
  string local_390;
  ostringstream local_370 [8];
  ostringstream w_1;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream w;
  uint local_5c;
  string *psStack_58;
  uint pmax;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue plen;
  cmLocalGenerator *this_local;
  
  this->ObjectPathMax = 1000;
  this_00 = this->Makefile;
  plen.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_OBJECT_PATH_MAX",&local_39);
  local_18 = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  psStack_58 = local_18.Value;
  bVar1 = cmNonempty(local_18);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_18);
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar3,"%u",&local_5c);
    if (iVar2 == 1) {
      if (local_5c < 0x80) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar4 = std::operator<<((ostream *)local_1d8,"CMAKE_OBJECT_PATH_MAX is set to ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5c);
        poVar4 = std::operator<<(poVar4,", which is less than the minimum of 128.  ");
        std::operator<<(poVar4,"The value will be ignored.");
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
      }
      else {
        this->ObjectPathMax = (ulong)local_5c;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_370);
      poVar4 = std::operator<<((ostream *)local_370,"CMAKE_OBJECT_PATH_MAX is set to \"");
      psVar5 = cmValue::operator*[abi_cxx11_(&local_18);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\", which fails to parse as a positive integer.  ");
      std::operator<<(poVar4,"The value will be ignored.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::ostringstream::~ostringstream(local_370);
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->ObjectMaxPathViolations);
  return;
}

Assistant:

void cmLocalGenerator::ComputeObjectMaxPath()
{
// Choose a maximum object file name length.
#if defined(_WIN32) || defined(__CYGWIN__)
  this->ObjectPathMax = 250;
#else
  this->ObjectPathMax = 1000;
#endif
  cmValue plen = this->Makefile->GetDefinition("CMAKE_OBJECT_PATH_MAX");
  if (cmNonempty(plen)) {
    unsigned int pmax;
    if (sscanf(plen->c_str(), "%u", &pmax) == 1) {
      if (pmax >= 128) {
        this->ObjectPathMax = pmax;
      } else {
        std::ostringstream w;
        w << "CMAKE_OBJECT_PATH_MAX is set to " << pmax
          << ", which is less than the minimum of 128.  "
          << "The value will be ignored.";
        this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
      }
    } else {
      std::ostringstream w;
      w << "CMAKE_OBJECT_PATH_MAX is set to \"" << *plen
        << "\", which fails to parse as a positive integer.  "
        << "The value will be ignored.";
      this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }
  this->ObjectMaxPathViolations.clear();
}